

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.c
# Opt level: O3

void init_sound(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ALLEGRO_SAMPLE_INSTANCE *pAVar3;
  char cVar4;
  uint uVar5;
  undefined1 *puVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  int *piVar10;
  int iVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  float fVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  float fVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  cVar4 = al_is_audio_installed();
  if (cVar4 == '\0') {
    return;
  }
  iVar11 = 0x2000;
  zap = create_sample_u8(0x5622,0x2000);
  puVar6 = (undefined1 *)al_get_sample_data(zap);
  fVar14 = 0.025;
  fVar13 = 0.02;
  fVar30 = 0.0;
  fVar25 = 0.0;
  do {
    dVar15 = fmod((double)fVar25,1.0);
    dVar16 = fmod((double)fVar30,1.0);
    *puVar6 = (char)(int)((double)((float)iVar11 * 0.00012207031 * 127.0) * (dVar16 + dVar15 + -1.0)
                         + 128.0);
    fVar30 = fVar30 + fVar14;
    fVar25 = fVar25 + fVar13;
    fVar14 = fVar14 + -1.25e-06;
    fVar13 = fVar13 + -1e-06;
    puVar6 = puVar6 + 1;
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  iVar11 = 0x2000;
  bang = create_sample_u8(0x5622,0x2000);
  puVar6 = (undefined1 *)al_get_sample_data(bang);
  fVar14 = 0.0;
  do {
    uVar5 = rand();
    fVar14 = fVar14 * 0.75 + ((float)(uVar5 & 0xff) / 255.0 + -0.5) * 0.25;
    *puVar6 = (char)(int)((float)iVar11 * 0.00012207031 * 255.0 * fVar14 + 128.0);
    puVar6 = puVar6 + 1;
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  iVar11 = 0x6000;
  bigbang = create_sample_u8(0x2b11,0x6000);
  lVar7 = al_get_sample_data(bigbang);
  fVar13 = 0.0;
  fVar30 = 0.0;
  fVar14 = 0.0;
  lVar12 = 0;
  do {
    fVar25 = ((float)(int)lVar12 / 24576.0) * 0.4 + 0.5;
    uVar5 = rand();
    fVar14 = (1.0 - fVar25) * ((float)(uVar5 & 0xff) / 255.0 + -0.5) + fVar14 * fVar25;
    dVar15 = sin((double)fVar30);
    dVar16 = sin((double)fVar13);
    *(char *)(lVar7 + lVar12) =
         (char)(int)((double)(((float)iVar11 / 24576.0) * 128.0) *
                     ((dVar16 + dVar15) * 0.25 + (double)fVar14) + 128.0);
    fVar13 = (float)((double)fVar13 + 0.04);
    fVar30 = (float)((double)fVar30 + 0.03);
    lVar12 = lVar12 + 1;
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  iVar11 = 0x2000;
  ping = create_sample_u8(0x5622,0x2000);
  puVar6 = (undefined1 *)al_get_sample_data(ping);
  fVar14 = 0.0;
  fVar13 = 0.0;
  do {
    dVar15 = sin((double)fVar13);
    dVar16 = sin((double)fVar14);
    *puVar6 = (char)(int)((double)((float)iVar11 * 0.00012207031 * 31.0) * (dVar16 + dVar15 + -1.0)
                         + 128.0);
    fVar14 = (float)((double)fVar14 + 0.3);
    fVar13 = (float)((double)fVar13 + 0.2);
    puVar6 = puVar6 + 1;
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  ping_timer = (ALLEGRO_TIMER *)al_create_timer(0x3fd3333333333333);
  if (no_music == 0) {
    cVar4 = al_is_audio_installed();
    if (cVar4 != '\0') {
      sine = create_sample_u8(0x5622,0x40);
      lVar7 = al_get_sample_data(sine);
      dVar15 = 0.0;
      lVar12 = 0;
      do {
        dVar16 = sin(dVar15 * 3.141592653589793 * 0.03125);
        dVar17 = sin((dVar15 * 3.141592653589793) / 12.0);
        *(char *)(lVar7 + lVar12) = (char)(int)((dVar17 + dVar16) * 8.0 + 128.0);
        dVar15 = dVar15 + 1.0;
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 0x40);
      square = create_sample_u8(0x5622,0x40);
      lVar7 = al_get_sample_data(square);
      auVar2 = _DAT_0010c930;
      auVar1 = _DAT_0010c920;
      uVar5 = 0xc;
      uVar18 = 0xd;
      uVar19 = 0xe;
      uVar20 = 0xf;
      uVar21 = 8;
      uVar22 = 9;
      uVar23 = 10;
      uVar24 = 0xb;
      uVar26 = 4;
      uVar27 = 5;
      uVar28 = 6;
      uVar29 = 7;
      uVar31 = 0;
      uVar32 = 1;
      uVar33 = 2;
      uVar34 = 3;
      lVar12 = 0;
      do {
        auVar35._0_4_ = -(uint)((int)(uVar31 ^ 0x80000000) < -0x7fffffe0);
        auVar35._4_4_ = -(uint)((int)(uVar32 ^ 0x80000000) < -0x7fffffe0);
        auVar35._8_4_ = -(uint)((int)(uVar33 ^ 0x80000000) < -0x7fffffe0);
        auVar35._12_4_ = -(uint)((int)(uVar34 ^ 0x80000000) < -0x7fffffe0);
        auVar37._0_4_ = -(uint)((int)(uVar26 ^ 0x80000000) < -0x7fffffe0);
        auVar37._4_4_ = -(uint)((int)(uVar27 ^ 0x80000000) < -0x7fffffe0);
        auVar37._8_4_ = -(uint)((int)(uVar28 ^ 0x80000000) < -0x7fffffe0);
        auVar37._12_4_ = -(uint)((int)(uVar29 ^ 0x80000000) < -0x7fffffe0);
        auVar35 = packssdw(auVar35,auVar37);
        auVar36._0_4_ = -(uint)((int)(uVar21 ^ 0x80000000) < -0x7fffffe0);
        auVar36._4_4_ = -(uint)((int)(uVar22 ^ 0x80000000) < -0x7fffffe0);
        auVar36._8_4_ = -(uint)((int)(uVar23 ^ 0x80000000) < -0x7fffffe0);
        auVar36._12_4_ = -(uint)((int)(uVar24 ^ 0x80000000) < -0x7fffffe0);
        auVar38._0_4_ = -(uint)((int)(uVar5 ^ 0x80000000) < -0x7fffffe0);
        auVar38._4_4_ = -(uint)((int)(uVar18 ^ 0x80000000) < -0x7fffffe0);
        auVar38._8_4_ = -(uint)((int)(uVar19 ^ 0x80000000) < -0x7fffffe0);
        auVar38._12_4_ = -(uint)((int)(uVar20 ^ 0x80000000) < -0x7fffffe0);
        auVar37 = packssdw(auVar36,auVar38);
        auVar35 = packsswb(auVar35,auVar37);
        *(undefined1 (*) [16])(lVar7 + lVar12) = auVar35 & auVar2 | ~auVar35 & auVar1;
        lVar12 = lVar12 + 0x10;
        uVar31 = uVar31 + 0x10;
        uVar32 = uVar32 + 0x10;
        uVar33 = uVar33 + 0x10;
        uVar34 = uVar34 + 0x10;
        uVar26 = uVar26 + 0x10;
        uVar27 = uVar27 + 0x10;
        uVar28 = uVar28 + 0x10;
        uVar29 = uVar29 + 0x10;
        uVar21 = uVar21 + 0x10;
        uVar22 = uVar22 + 0x10;
        uVar23 = uVar23 + 0x10;
        uVar24 = uVar24 + 0x10;
        uVar5 = uVar5 + 0x10;
        uVar18 = uVar18 + 0x10;
        uVar19 = uVar19 + 0x10;
        uVar20 = uVar20 + 0x10;
      } while (lVar12 != 0x40);
      saw = create_sample_u8(0x5622,0x40);
      puVar8 = (undefined8 *)al_get_sample_data(saw);
      *puVar8 = 0x7979797978787878;
      puVar8[1] = 0x7b7b7b7b7a7a7a7a;
      puVar8[2] = 0x7d7d7d7d7c7c7c7c;
      puVar8[3] = 0x7f7f7f7f7e7e7e7e;
      puVar8[4] = 0x8181818180808080;
      puVar8[5] = 0x8383838382828282;
      puVar8[6] = 0x8585858584848484;
      puVar8[7] = 0x8787878786868686;
      iVar11 = 0x400;
      bd = create_sample_u8(0x5622,0x400);
      puVar6 = (undefined1 *)al_get_sample_data(bd);
      dVar15 = 0.0;
      do {
        dVar16 = sin(dVar15 / 48.0);
        dVar17 = sin(dVar15 * 0.03125);
        *puVar6 = (char)(int)((double)((float)iVar11 * 0.0625) * (dVar17 + dVar16) + 128.0);
        puVar6 = puVar6 + 1;
        dVar15 = dVar15 + 1.0;
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      iVar11 = 0xc00;
      snare = create_sample_u8(0x5622,0xc00);
      puVar6 = (undefined1 *)al_get_sample_data(snare);
      fVar14 = 0.0;
      do {
        uVar5 = rand();
        fVar14 = fVar14 * 0.9 + ((float)(uVar5 & 0xff) / 255.0 + -0.5) * 0.1;
        *puVar6 = (char)(int)(((float)iVar11 / 24.0) * fVar14 + 128.0);
        puVar6 = puVar6 + 1;
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      iVar11 = 0x400;
      hihat = create_sample_u8(0x5622,0x400);
      puVar6 = (undefined1 *)al_get_sample_data(hihat);
      dVar15 = 0.0;
      do {
        dVar16 = sin(dVar15 / 4.2);
        uVar5 = rand();
        *puVar6 = (char)(int)((double)((float)iVar11 / 192.0) *
                              ((double)(uVar5 & 0xff) / 255.0 + -0.5 + dVar16) + 128.0);
        puVar6 = puVar6 + 1;
        dVar15 = dVar15 + 1.0;
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      piVar10 = freq_table;
      lVar7 = 0;
      do {
        dVar15 = exp2((double)(int)lVar7 / 12.0);
        *piVar10 = (int)(dVar15 * 350.0);
        lVar7 = lVar7 + 1;
        piVar10 = piVar10 + 1;
      } while (lVar7 != 0x100);
      part_time[0] = 0;
      part_time[1] = 0;
      part_time[2] = 0;
      part_time[3] = 0;
      part_pos[0] = part_1;
      part_pos[1] = part_2;
      part_pos[2] = part_3;
      part_pos[3] = part_4;
      part_voice[0] = (ALLEGRO_SAMPLE_INSTANCE *)al_create_sample_instance(sine);
      part_voice[1] = (ALLEGRO_SAMPLE_INSTANCE *)al_create_sample_instance(square);
      part_voice[2] = (ALLEGRO_SAMPLE_INSTANCE *)al_create_sample_instance(saw);
      part_voice[3] = (ALLEGRO_SAMPLE_INSTANCE *)al_create_sample_instance(bd);
      pAVar3 = part_voice[0];
      uVar9 = al_get_default_mixer();
      al_attach_sample_instance_to_mixer(pAVar3,uVar9);
      pAVar3 = part_voice[1];
      uVar9 = al_get_default_mixer();
      al_attach_sample_instance_to_mixer(pAVar3,uVar9);
      pAVar3 = part_voice[2];
      uVar9 = al_get_default_mixer();
      al_attach_sample_instance_to_mixer(pAVar3,uVar9);
      pAVar3 = part_voice[3];
      uVar9 = al_get_default_mixer();
      al_attach_sample_instance_to_mixer(pAVar3,uVar9);
      al_set_sample_instance_playmode(part_voice[0],0x101);
      al_set_sample_instance_playmode(part_voice[1],0x101);
      al_set_sample_instance_playmode(part_voice[2],0x101);
      al_set_sample_instance_playmode(part_voice[3],0x100);
      al_set_sample_instance_gain(part_voice[0]);
      al_set_sample_instance_gain(part_voice[1]);
      al_set_sample_instance_gain(part_voice[2]);
      al_set_sample_instance_gain(part_voice[3]);
      al_set_sample_instance_pan(part_voice[0]);
      al_set_sample_instance_pan(part_voice[1]);
      al_set_sample_instance_pan(part_voice[2]);
      al_set_sample_instance_pan(part_voice[3]);
      music_timer = (ALLEGRO_TIMER *)al_create_timer(0x3fa745d1745d1746);
    }
    al_start_timer(music_timer);
  }
  sound_update_thread = (ALLEGRO_THREAD *)al_create_thread(sound_update_proc,0);
  al_start_thread(sound_update_thread);
  return;
}

Assistant:

void init_sound()
{
   float f, osc1, osc2, freq1, freq2, vol, val;
   char *p;
   int len;
   int i;

   if (!al_is_audio_installed())
      return;

   /* zap (firing sound) consists of multiple falling saw waves */
   len = 8192;
   zap = create_sample_u8(22050, len);

   p = (char *)al_get_sample_data(zap);

   osc1 = 0;
   freq1 = 0.02;

   osc2 = 0;
   freq2 = 0.025;

   for (i=0; i<len; i++) {
      vol = (float)(len - i) / (float)len * 127;

      *p = 128 + (fmod(osc1, 1) + fmod(osc2, 1) - 1) * vol;

      osc1 += freq1;
      freq1 -= 0.000001;

      osc2 += freq2;
      freq2 -= 0.00000125;

      p++;
   }

   /* bang (explosion) consists of filtered noise */
   len = 8192;
   bang = create_sample_u8(22050, len);

   p = (char *)al_get_sample_data(bang);

   val = 0;

   for (i=0; i<len; i++) {
      vol = (float)(len - i) / (float)len * 255;
      val = (val * 0.75) + (RAND * 0.25);
      *p = 128 + val * vol;
      p++;
   }

   /* big bang (explosion) consists of noise plus rumble */
   len = 24576;
   bigbang = create_sample_u8(11025, len);

   p = (char *)al_get_sample_data(bigbang);

   val = 0;

   osc1 = 0;
   osc2 = 0;

   for (i=0; i<len; i++) {
      vol = (float)(len - i) / (float)len * 128;

      f = 0.5 + ((float)i / (float)len * 0.4);
      val = (val * f) + (RAND * (1-f));

      *p = 128 + (val + (sin(osc1) + sin(osc2)) / 4) * vol;

      osc1 += 0.03;
      osc2 += 0.04;

      p++;
   }

   /* ping consists of two sine waves */
   len = 8192;
   ping = create_sample_u8(22050, len);

   p = (char *)al_get_sample_data(ping);

   osc1 = 0;
   osc2 = 0;

   for (i=0; i<len; i++) {
      vol = (float)(len - i) / (float)len * 31;

      *p = 128 + (sin(osc1) + sin(osc2) - 1) * vol;

      osc1 += 0.2;
      osc2 += 0.3;

      p++;
   }

   ping_timer = al_create_timer(0.3);

   /* set up my lurvely music player :-) */
   if (!no_music) {
      init_music();
      al_start_timer(music_timer);
   }

   sound_update_thread = al_create_thread(sound_update_proc, NULL);
   al_start_thread(sound_update_thread);
}